

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des3.c
# Opt level: O0

int des_ede3_cfb8_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t inl)

{
  int iVar1;
  DES_key_schedule *pDVar2;
  void *pvVar3;
  void *pvVar4;
  ulong in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  ulong local_20;
  uchar *local_18;
  uchar *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_20 = in_RCX; 0x3fffffffffffffff < local_20; local_20 = local_20 + 0xc000000000000000) {
    pDVar2 = (DES_key_schedule *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar3 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar4 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    DES_ede3_cfb_encrypt
              (local_18,local_10,8,0x4000000000000000,pDVar2,
               (DES_key_schedule *)((long)pvVar3 + 0x80),(DES_key_schedule *)((long)pvVar4 + 0x100),
               (DES_cblock *)in_RDI->iv,iVar1);
    local_18 = local_18 + 0x4000000000000000;
    local_10 = local_10 + 0x4000000000000000;
  }
  if (local_20 != 0) {
    pDVar2 = (DES_key_schedule *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar3 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    pvVar4 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    iVar1 = EVP_CIPHER_CTX_is_encrypting(in_RDI);
    DES_ede3_cfb_encrypt
              (local_18,local_10,8,local_20,pDVar2,(DES_key_schedule *)((long)pvVar3 + 0x80),
               (DES_key_schedule *)((long)pvVar4 + 0x100),(DES_cblock *)in_RDI->iv,iVar1);
  }
  return 1;
}

Assistant:

static int des_ede3_cfb8_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                                const unsigned char *in, size_t inl)
{
    while (inl >= EVP_MAXCHUNK) {
        DES_ede3_cfb_encrypt(in, out, 8, (long)EVP_MAXCHUNK,
                             &data(ctx)->ks1, &data(ctx)->ks2,
                             &data(ctx)->ks3, (DES_cblock *)ctx->iv,
                             EVP_CIPHER_CTX_is_encrypting(ctx));
        inl -= EVP_MAXCHUNK;
        in += EVP_MAXCHUNK;
        out += EVP_MAXCHUNK;
    }
    if (inl)
        DES_ede3_cfb_encrypt(in, out, 8, (long)inl,
                             &data(ctx)->ks1, &data(ctx)->ks2,
                             &data(ctx)->ks3, (DES_cblock *)ctx->iv,
                             EVP_CIPHER_CTX_is_encrypting(ctx));
    return 1;
}